

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O0

int accumulate_fit(float *flr,float *mdct,int x0,int x1,lsfit_acc *a,int n,vorbis_info_floor1 *info)

{
  int iVar1;
  int iVar2;
  int local_68;
  int quantized;
  int nb;
  int xyb;
  int y2b;
  int x2b;
  int yb;
  int xb;
  int na;
  int xya;
  int y2a;
  int x2a;
  int ya;
  int xa;
  long i;
  int n_local;
  lsfit_acc *a_local;
  int x1_local;
  int x0_local;
  float *mdct_local;
  float *flr_local;
  
  x2a = 0;
  y2a = 0;
  xya = 0;
  na = 0;
  xb = 0;
  yb = 0;
  x2b = 0;
  y2b = 0;
  xyb = 0;
  nb = 0;
  quantized = 0;
  local_68 = 0;
  memset(a,0,0x38);
  a->x0 = x0;
  a->x1 = x1;
  a_local._0_4_ = x1;
  if (n <= x1) {
    a_local._0_4_ = n + -1;
  }
  for (_ya = (long)x0; _ya <= (int)a_local; _ya = _ya + 1) {
    iVar2 = vorbis_dBquant(flr + _ya);
    if (iVar2 != 0) {
      iVar1 = (int)_ya;
      if (mdct[_ya] + info->twofitatten < flr[_ya]) {
        x2b = x2b + iVar1;
        y2b = iVar2 + y2b;
        xyb = xyb + iVar1 * iVar1;
        nb = iVar2 * iVar2 + nb;
        quantized = quantized + iVar1 * iVar2;
        local_68 = local_68 + 1;
      }
      else {
        x2a = x2a + iVar1;
        y2a = iVar2 + y2a;
        xya = xya + iVar1 * iVar1;
        na = iVar2 * iVar2 + na;
        xb = xb + iVar1 * iVar2;
        yb = yb + 1;
      }
    }
  }
  a->xa = x2a;
  a->ya = y2a;
  a->x2a = xya;
  a->y2a = na;
  a->xya = xb;
  a->an = yb;
  a->xb = x2b;
  a->yb = y2b;
  a->x2b = xyb;
  a->y2b = nb;
  a->xyb = quantized;
  a->bn = local_68;
  return yb;
}

Assistant:

static int accumulate_fit(const float *flr,const float *mdct,
                          int x0, int x1,lsfit_acc *a,
                          int n,vorbis_info_floor1 *info){
  long i;

  int xa=0,ya=0,x2a=0,y2a=0,xya=0,na=0, xb=0,yb=0,x2b=0,y2b=0,xyb=0,nb=0;

  memset(a,0,sizeof(*a));
  a->x0=x0;
  a->x1=x1;
  if(x1>=n)x1=n-1;

  for(i=x0;i<=x1;i++){
    int quantized=vorbis_dBquant(flr+i);
    if(quantized){
      if(mdct[i]+info->twofitatten>=flr[i]){
        xa  += i;
        ya  += quantized;
        x2a += i*i;
        y2a += quantized*quantized;
        xya += i*quantized;
        na++;
      }else{
        xb  += i;
        yb  += quantized;
        x2b += i*i;
        y2b += quantized*quantized;
        xyb += i*quantized;
        nb++;
      }
    }
  }

  a->xa=xa;
  a->ya=ya;
  a->x2a=x2a;
  a->y2a=y2a;
  a->xya=xya;
  a->an=na;

  a->xb=xb;
  a->yb=yb;
  a->x2b=x2b;
  a->y2b=y2b;
  a->xyb=xyb;
  a->bn=nb;

  return(na);
}